

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_generate_bounding_box
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  SDF_Edge edge;
  SDF_Signed_Distance sdf1;
  FT_26D6_Vec point;
  int iVar4;
  FT_SDFFormat FVar5;
  int max_value;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  SDF_Signed_Distance SVar13;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int local_144;
  char local_139;
  FT_UInt index_1;
  FT_Char current_sign;
  undefined4 local_130;
  uint local_f8;
  FT_16D16 diff;
  FT_UInt index;
  SDF_Signed_Distance dist;
  FT_26D6_Vec grid_point;
  long local_d0;
  long local_c8;
  long local_c0;
  int local_b8;
  int local_b4;
  FT_Int y;
  FT_Int x;
  FT_CBox cbox;
  SDF_Edge *edges;
  FT_Pointer pvStack_80;
  FT_16D16 fixed_spread;
  SDF_Signed_Distance *dists;
  FT_SDFFormat *buffer;
  SDF_Contour *contours;
  int local_60;
  FT_Int sp_sq;
  FT_Int j;
  FT_Int i;
  FT_Int rows;
  FT_Int width;
  FT_Memory memory;
  FT_Bitmap *pFStack_40;
  FT_Error error;
  FT_Bitmap *bitmap_local;
  SDF_Shape *pSStack_30;
  FT_UInt spread_local;
  SDF_Shape *shape_local;
  FT_Orientation local_1c;
  undefined8 local_14;
  SDF_Params internal_params_local;
  
  local_1c = internal_params.overload_sign;
  register0x00000038 = internal_params._0_8_;
  memory._4_4_ = 0;
  _rows = (FT_Memory)0x0;
  pvStack_80 = (void *)0x0;
  max_value = spread << 0x10;
  pFStack_40 = bitmap;
  bitmap_local._4_4_ = spread;
  pSStack_30 = shape;
  local_14 = register0x00000038;
  internal_params_local.orientation = local_1c;
  if ((shape == (SDF_Shape *)0x0) || (bitmap == (FT_Bitmap *)0x0)) {
    memory._4_4_ = 6;
  }
  else if ((spread < 2) || (0x20 < spread)) {
    memory._4_4_ = 6;
  }
  else {
    _rows = shape->memory;
    if (_rows == (FT_Memory)0x0) {
      memory._4_4_ = 6;
    }
    else {
      pvStack_80 = ft_mem_alloc(_rows,(ulong)(bitmap->width * bitmap->rows) * 0xc,
                                (FT_Error *)((long)&memory + 4));
      if (memory._4_4_ == 0) {
        buffer = (FT_SDFFormat *)pSStack_30->contours;
        uVar1 = pFStack_40->width;
        uVar2 = pFStack_40->rows;
        puVar3 = pFStack_40->buffer;
        if ((uVar1 == 0) || (uVar2 == 0)) {
          memory._4_4_ = 0x13;
        }
        else {
          for (; buffer != (FT_SDFFormat *)0x0; buffer = *(FT_SDFFormat **)(buffer + 0x18)) {
            for (cbox.yMax = *(FT_Pos *)(buffer + 0x10); cbox.yMax != 0;
                cbox.yMax = *(FT_Pos *)(cbox.yMax + 0x48)) {
              edge.next._0_4_ = in_stack_fffffffffffffea8;
              edge._0_72_ = *(undefined1 (*) [72])(cbox.yMax + 8);
              edge.next._4_4_ = in_stack_fffffffffffffeac;
              get_control_box(edge);
              iVar6 = (int)((grid_point.y + -0x3f) / 0x40) - bitmap_local._4_4_;
              uVar10 = (ulong)bitmap_local._4_4_;
              uVar11 = (ulong)bitmap_local._4_4_;
              for (local_b8 = (int)((local_d0 + -0x3f) / 0x40) - bitmap_local._4_4_;
                  local_b4 = iVar6, (long)local_b8 < (long)((local_c0 + 0x3f) / 0x40 + uVar11);
                  local_b8 = local_b8 + 1) {
                for (; (long)local_b4 < (long)((local_c8 + 0x3f) / 0x40 + uVar10);
                    local_b4 = local_b4 + 1) {
                  memset(&dist.cross,0,0x10);
                  diff = 0x7fffffff;
                  index = 0;
                  dist.distance = 0;
                  if ((((-1 < local_b4) && (local_b4 < (int)uVar1)) && (-1 < local_b8)) &&
                     (local_b8 < (int)uVar2)) {
                    dist._4_8_ = (long)(local_b4 << 6) + 0x20;
                    point.y = (long)(local_b8 << 6) + 0x20;
                    point.x = dist._4_8_;
                    memory._4_4_ = sdf_edge_get_min_distance
                                             ((SDF_Edge *)cbox.yMax,point,
                                              (SDF_Signed_Distance *)&diff);
                    if (memory._4_4_ != 0) goto LAB_003241d8;
                    if ((int)local_14 == 1) {
                      dist.distance = CONCAT31(dist.distance._1_3_,-(char)dist.distance);
                    }
                    if (diff <= max_value) {
                      iVar4 = local_b8;
                      if (local_14._5_1_ == '\0') {
                        iVar4 = (uVar2 - local_b8) + -1;
                      }
                      local_f8 = iVar4 * uVar1 + local_b4;
                      if (*(char *)((long)pvStack_80 + (ulong)local_f8 * 0xc + 8) == '\0') {
                        puVar8 = (undefined8 *)((long)pvStack_80 + (ulong)local_f8 * 0xc);
                        *puVar8 = _diff;
                        *(FT_16D16 *)(puVar8 + 1) = dist.distance;
                      }
                      else {
                        if (*(int *)((long)pvStack_80 + (ulong)local_f8 * 0xc) - diff < 0) {
                          local_144 = -(*(int *)((long)pvStack_80 + (ulong)local_f8 * 0xc) - diff);
                        }
                        else {
                          local_144 = *(int *)((long)pvStack_80 + (ulong)local_f8 * 0xc) - diff;
                        }
                        if (local_144 < 0x21) {
                          uVar12 = (ulong)local_f8;
                          puVar8 = (undefined8 *)((long)pvStack_80 + uVar12 * 0xc);
                          sdf1._8_4_ = *(undefined4 *)((long)pvStack_80 + uVar12 * 0xc + 8);
                          sdf1._0_8_ = *(undefined8 *)((long)pvStack_80 + uVar12 * 0xc);
                          SVar13._8_4_ = dist.distance;
                          SVar13.distance = diff;
                          SVar13.cross = index;
                          SVar13 = resolve_corner(sdf1,SVar13);
                          local_130 = CONCAT31(local_130._1_3_,SVar13.sign);
                          *puVar8 = SVar13._0_8_;
                          *(undefined4 *)(puVar8 + 1) = local_130;
                        }
                        else if (diff < *(int *)((long)pvStack_80 + (ulong)local_f8 * 0xc)) {
                          puVar8 = (undefined8 *)((long)pvStack_80 + (ulong)local_f8 * 0xc);
                          *puVar8 = _diff;
                          *(FT_16D16 *)(puVar8 + 1) = dist.distance;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          for (local_60 = 0; local_60 < (int)uVar2; local_60 = local_60 + 1) {
            local_139 = -1;
            if ((internal_params_local.orientation != FT_ORIENTATION_FILL_RIGHT) &&
               (local_139 = '\x01', (int)internal_params_local.orientation < 0)) {
              local_139 = -1;
            }
            for (sp_sq = 0; sp_sq < (int)uVar1; sp_sq = sp_sq + 1) {
              uVar7 = local_60 * uVar1 + sp_sq;
              if (*(char *)((long)pvStack_80 + (ulong)uVar7 * 0xc + 8) == '\0') {
                *(int *)((long)pvStack_80 + (ulong)uVar7 * 0xc) = max_value;
              }
              else {
                local_139 = *(char *)((long)pvStack_80 + (ulong)uVar7 * 0xc + 8);
              }
              if (max_value < *(int *)((long)pvStack_80 + (ulong)uVar7 * 0xc)) {
                *(int *)((long)pvStack_80 + (ulong)uVar7 * 0xc) = max_value;
              }
              if (local_14._4_1_ == '\0') {
                iVar6 = (int)local_139;
              }
              else {
                iVar6 = -(int)local_139;
              }
              piVar9 = (int *)((long)pvStack_80 + (ulong)uVar7 * 0xc);
              *piVar9 = iVar6 * *piVar9;
              FVar5 = map_fixed_to_sdf(*(FT_16D16 *)((long)pvStack_80 + (ulong)uVar7 * 0xc),
                                       max_value);
              puVar3[uVar7] = FVar5;
            }
          }
        }
      }
    }
  }
LAB_003241d8:
  ft_mem_free(_rows,pvStack_80);
  return memory._4_4_;
}

Assistant:

static FT_Error
  sdf_generate_bounding_box( const SDF_Params  internal_params,
                             const SDF_Shape*  shape,
                             FT_UInt           spread,
                             const FT_Bitmap*  bitmap )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = NULL;

    FT_Int  width, rows, i, j;
    FT_Int  sp_sq;            /* max value to check   */

    SDF_Contour*   contours;  /* list of all contours */
    FT_SDFFormat*  buffer;    /* the bitmap buffer    */

    /* This buffer has the same size in indices as the    */
    /* bitmap buffer.  When we check a pixel position for */
    /* a shortest distance we keep it in this buffer.     */
    /* This way we can find out which pixel is set,       */
    /* and also determine the signs properly.             */
    SDF_Signed_Distance*  dists = NULL;

    const FT_16D16  fixed_spread = (FT_16D16)FT_INT_16D16( spread );


    if ( !shape || !bitmap )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( spread < MIN_SPREAD || spread > MAX_SPREAD )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = shape->memory;
    if ( !memory )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( FT_ALLOC( dists,
                   bitmap->width * bitmap->rows * sizeof ( *dists ) ) )
      goto Exit;

    contours = shape->contours;
    width    = (FT_Int)bitmap->width;
    rows     = (FT_Int)bitmap->rows;
    buffer   = (FT_SDFFormat*)bitmap->buffer;

    if ( USE_SQUARED_DISTANCES )
      sp_sq = FT_INT_16D16( (FT_Int)( spread * spread ) );
    else
      sp_sq = fixed_spread;

    if ( width == 0 || rows == 0 )
    {
      FT_TRACE0(( "sdf_generate:"
                  " Cannot render glyph with width/height == 0\n" ));
      FT_TRACE0(( "             "
                  " (width, height provided [%d, %d])", width, rows ));

      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* loop over all contours */
    while ( contours )
    {
      SDF_Edge*  edges = contours->edges;


      /* loop over all edges */
      while ( edges )
      {
        FT_CBox  cbox;
        FT_Int   x, y;


        /* get the control box and increase it by `spread' */
        cbox = get_control_box( *edges );

        cbox.xMin = ( cbox.xMin - 63 ) / 64 - ( FT_Pos )spread;
        cbox.xMax = ( cbox.xMax + 63 ) / 64 + ( FT_Pos )spread;
        cbox.yMin = ( cbox.yMin - 63 ) / 64 - ( FT_Pos )spread;
        cbox.yMax = ( cbox.yMax + 63 ) / 64 + ( FT_Pos )spread;

        /* now loop over the pixels in the control box. */
        for ( y = cbox.yMin; y < cbox.yMax; y++ )
        {
          for ( x = cbox.xMin; x < cbox.xMax; x++ )
          {
            FT_26D6_Vec          grid_point = zero_vector;
            SDF_Signed_Distance  dist       = max_sdf;
            FT_UInt              index      = 0;
            FT_16D16             diff       = 0;


            if ( x < 0 || x >= width )
              continue;
            if ( y < 0 || y >= rows )
              continue;

            grid_point.x = FT_INT_26D6( x );
            grid_point.y = FT_INT_26D6( y );

            /* This `grid_point` is at the corner, but we */
            /* use the center of the pixel.               */
            grid_point.x += FT_INT_26D6( 1 ) / 2;
            grid_point.y += FT_INT_26D6( 1 ) / 2;

            FT_CALL( sdf_edge_get_min_distance( edges,
                                                grid_point,
                                                &dist ) );

            if ( internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
              dist.sign = -dist.sign;

            /* ignore if the distance is greater than spread;       */
            /* otherwise it creates artifacts due to the wrong sign */
            if ( dist.distance > sp_sq )
              continue;

            /* take the square root of the distance if required */
            if ( USE_SQUARED_DISTANCES )
              dist.distance = square_root( dist.distance );

            if ( internal_params.flip_y )
              index = (FT_UInt)( y * width + x );
            else
              index = (FT_UInt)( ( rows - y - 1 ) * width + x );

            /* check whether the pixel is set or not */
            if ( dists[index].sign == 0 )
              dists[index] = dist;
            else
            {
              diff = FT_ABS( dists[index].distance - dist.distance );

              if ( diff <= CORNER_CHECK_EPSILON )
                dists[index] = resolve_corner( dists[index], dist );
              else if ( dists[index].distance > dist.distance )
                dists[index] = dist;
            }
          }
        }

        edges = edges->next;
      }

      contours = contours->next;
    }

    /* final pass */
    for ( j = 0; j < rows; j++ )
    {
      /* We assume the starting pixel of each row is outside. */
      FT_Char  current_sign = -1;
      FT_UInt  index;


      if ( internal_params.overload_sign != 0 )
        current_sign = internal_params.overload_sign < 0 ? -1 : 1;

      for ( i = 0; i < width; i++ )
      {
        index = (FT_UInt)( j * width + i );

        /* if the pixel is not set                     */
        /* its shortest distance is more than `spread` */
        if ( dists[index].sign == 0 )
          dists[index].distance = fixed_spread;
        else
          current_sign = dists[index].sign;

        /* clamp the values */
        if ( dists[index].distance > fixed_spread )
          dists[index].distance = fixed_spread;

        /* flip sign if required */
        dists[index].distance *= internal_params.flip_sign ? -current_sign
                                                           :  current_sign;

        /* concatenate to appropriate format */
        buffer[index] = map_fixed_to_sdf( dists[index].distance,
                                          fixed_spread );
      }
    }

  Exit:
    FT_FREE( dists );
    return error;
  }